

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::EnumValueOptions::ByteSizeLong(EnumValueOptions *this)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  uint uVar1;
  size_t sVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  long lVar6;
  
  sVar2 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  lVar6 = sVar2 + (long)*(int *)((long)&this->field_0 + 0x28) * 2;
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      ((UninterpretedOption *)*ppvVar3);
    lVar6 = lVar6 + sVar2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  sVar2 = lVar6 + (ulong)(((uVar1 & 0xc) >> 2) - ((uVar1 & 0xc) >> 3)) * 2;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sVar2 = sVar2 + sVar5 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions_FeatureSupport>
                        ((this->field_0)._impl_.feature_support_);
      sVar2 = sVar2 + sVar5 + 1;
    }
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t EnumValueOptions::ByteSizeLong() const {
  const EnumValueOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumValueOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x0000000cu & cached_has_bits) * 2;
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.FeatureSet features = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.feature_support_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}